

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

char * GetSmbiosString(uint8_t index,void *base)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,index) == 0) {
    base = (char *)0x0;
  }
  else {
    while (index = index + 0xff, index != '\0') {
      sVar1 = strlen((char *)base);
      base = (void *)((long)base + sVar1 + 1);
    }
  }
  return (char *)base;
}

Assistant:

const char *GetSmbiosString(uint8_t index, void *base)
{
    const char *strbase = (const char *)base;
    if (index == 0)
        return NULL;
    for (--index; index; --index) {
        strbase += strlen(strbase) + 1;
    }
    return strbase;
}